

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shellquote_shared.h
# Opt level: O0

QString * shellQuote(QString *arg)

{
  long lVar1;
  bool bVar2;
  QChar QVar3;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QChar *in_stack_ffffffffffffffc8;
  QString *pQVar4;
  undefined6 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  QVar3 = QDir::separator();
  QLatin1Char::QLatin1Char((QLatin1Char *)&stack0xfffffffffffffff3,'\\');
  QChar::QChar<QLatin1Char,_true>((QChar *)in_RDI,(QLatin1Char)(char)((ulong)pQVar4 >> 0x38));
  bVar2 = operator==((QChar *)in_RDI,in_stack_ffffffffffffffc8);
  if (bVar2) {
    shellQuoteWin((QString *)CONCAT26(QVar3.ucs,in_stack_fffffffffffffff0));
  }
  else {
    shellQuoteUnix(in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

static QString shellQuote(const QString &arg)
{
    if (QDir::separator() == QLatin1Char('\\'))
        return shellQuoteWin(arg);
    else
        return shellQuoteUnix(arg);
}